

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O3

void QBenchmarkValgrindUtils::cleanup(EVP_PKEY_CTX *ctx)

{
  long lVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QAnyStringView QVar3;
  QDir local_90 [8];
  QString local_88;
  QArrayDataPointer<QFileInfo> local_68;
  QString local_50;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (QString *)0x0;
  local_38.size = 0;
  local_50.d.d = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.d;
  local_50.d.ptr = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.ptr;
  local_50.d.size = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.size;
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_38,0,&local_50);
  QList<QString>::end((QList<QString> *)&local_38);
  QVar2.m_data = (storage_type *)0x4;
  QVar2.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar2);
  QVar3.m_size = (size_t)&local_88;
  QVar3.field_0.m_data = &local_68;
  QString::arg_impl(QVar3,(int)local_50.d.ptr,(QChar)(char16_t)local_50.d.size);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_38,local_38.size,(QString *)&local_68);
  QList<QString>::end((QList<QString> *)&local_38);
  if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  QDir::QDir(local_90,&local_88);
  QDir::entryInfoList(&local_68,local_90,&local_38,0x12,0xffffffff);
  QDir::~QDir(local_90);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
    lVar1 = local_68.size << 3;
    do {
      QFileInfo::fileName();
      QFile::remove(&local_88);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar1 = lVar1 + -8;
    } while (lVar1 != 0);
  }
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_68);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBenchmarkValgrindUtils::cleanup()
{
    QStringList nameFilters;
    QString base = QBenchmarkGlobalData::current->callgrindOutFileBase;
    Q_ASSERT(!base.isEmpty());
    nameFilters
        << base // overall summary
        << QString::fromLatin1("%1.*").arg(base); // individual dumps
    const QFileInfoList fiList = QDir().entryInfoList(nameFilters, QDir::Files | QDir::Readable);
    for (const QFileInfo &fileInfo : fiList) {
        const bool removeOk = QFile::remove(fileInfo.fileName());
        Q_ASSERT(removeOk);
        Q_UNUSED(removeOk);
    }
}